

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

value_type * __thiscall
nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[2]>
          (value_type *__return_storage_ptr__,void *this,char (*v) [2])

{
  char cVar1;
  size_t sVar2;
  ulong *local_68;
  size_type local_60;
  ulong local_58;
  undefined8 uStack_50;
  ulong *local_48;
  size_type local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  cVar1 = *this;
  if (cVar1 == '\x01') {
    local_68 = &local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,*(long *)((long)this + 8),
               *(long *)((long)this + 0x10) + *(long *)((long)this + 8));
  }
  else {
    local_48 = (ulong *)&local_38;
    sVar2 = strlen(*v);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,v,*v + sVar2);
    if (local_48 == (ulong *)&local_38) {
      local_48 = &local_58;
      uStack_50 = uStack_30;
    }
    local_58 = CONCAT71(uStack_37,local_38);
    local_60 = local_40;
    local_40 = 0;
    local_38 = 0;
    local_68 = local_48;
    local_48 = (ulong *)&local_38;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_68 == &local_58) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_58;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_50;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_58;
  }
  __return_storage_ptr__->_M_string_length = local_60;
  local_60 = 0;
  local_58 = local_58 & 0xffffffffffffff00;
  if ((cVar1 == '\0') && (local_48 != (ulong *)&local_38)) {
    local_68 = &local_58;
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

optional_constexpr14 value_type value_or( U && v ) optional_refref_qual
    {
#if optional_COMPILER_CLANG_VERSION
        return has_value() ? /*std::move*/( contained.value() ) : static_cast<T>(std::forward<U>( v ) );
#else
        return has_value() ? std::move( contained.value() ) : static_cast<T>(std::forward<U>( v ) );
#endif
    }